

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O2

string * __thiscall viface::VIface::getName_abi_cxx11_(string *__return_storage_ptr__,VIface *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->pimpl)._M_t.
               super___uniq_ptr_impl<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_>.
               _M_t.
               super__Tuple_impl<0UL,_viface::VIfaceImpl_*,_std::default_delete<viface::VIfaceImpl>_>
               .super__Head_base<0UL,_viface::VIfaceImpl_*,_false>._M_head_impl)->name);
  return __return_storage_ptr__;
}

Assistant:

string VIface::getName() const {
    return this->pimpl->getName();
}